

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linquadfelshaped.cc
# Opt level: O0

int main(int argc,char **argv)

{
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>_>
  MVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *s;
  size_type sVar6;
  ostream *poVar7;
  variable_value *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  element_type *peVar8;
  undefined4 extraout_var;
  element_type *peVar9;
  undefined4 extraout_var_00;
  element_type *peVar10;
  Scalar *pSVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WithFormat<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_a88;
  string local_990 [8];
  ofstream file;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  PredicateTrue local_699;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>
  local_698;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>
  local_660;
  double local_620;
  double H1_err_o2;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>
  local_610;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>
  local_5d8;
  double local_598;
  double H1_err_o1;
  undefined1 local_588 [7];
  anon_class_1_0_00000001 quadrule_provider;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_578;
  undefined1 local_568 [8];
  MeshFunctionGradFE<double,_double> mf_grad_o2;
  undefined1 local_538 [8];
  VectorXd solution_o2;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> fe_space_o2;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_508;
  undefined1 local_4f8 [8];
  MeshFunctionGradFE<double,_double> mf_grad_o1;
  undefined1 local_4c8 [8];
  VectorXd solution_o1;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space_o1;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_478;
  undefined1 local_470 [8];
  GmshReader reader;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_3e0;
  __single_object factory;
  undefined1 local_3b0 [8];
  path mesh_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string mesh_name;
  int mesh_idx;
  MatrixXd results;
  path local_2e0;
  undefined1 local_2b8 [8];
  path mesh_folder;
  path here;
  undefined1 local_260 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>
  mf_u_grad;
  undefined1 local_248 [6];
  anon_class_1_0_00000001_for_f_ u_grad;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:123:18)>
  mf_u;
  undefined1 local_230 [6];
  anon_class_1_0_00000001_for_f_ u;
  string local_210 [8];
  string output_file;
  key_type local_1e8;
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a8;
  undefined1 local_180 [8];
  variables_map vm;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  options_description desc;
  int num_meshes;
  char **argv_local;
  int argc_local;
  
  desc.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"allowed options",&local_c1);
  boost::program_options::options_description::options_description
            ((options_description *)local_a0,&local_c0,0x50,0x28);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)boost::program_options::options_description::add_options
                         ((options_description *)local_a0);
  s = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)
             &vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count,"output,o",
             (value_semantic *)s,"Name of the output file");
  boost::program_options::variables_map::variables_map((variables_map *)local_180);
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function_n(&local_1c8);
  boost::program_options::parse_command_line<char>
            (&local_1a8,argc,argv,(options_description *)local_a0,0,&local_1c8);
  boost::program_options::store(&local_1a8,(variables_map *)local_180,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a8);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"output",
             (allocator<char> *)(output_file.field_2._M_local_buf + 0xf));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&vm.super_abstract_variables_map.m_next,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)(output_file.field_2._M_local_buf + 0xf));
  if (sVar6 == 0) {
    poVar7 = boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_a0);
    std::operator<<(poVar7,'\n');
    argv_local._4_4_ = 1;
    output_file.field_2._8_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,"output",(allocator<char> *)&mf_u.field_0xf);
    this = boost::program_options::variables_map::operator[]
                     ((variables_map *)local_180,(string *)local_230);
    __str = boost::program_options::variable_value::as<std::__cxx11::string>(this);
    std::__cxx11::string::string(local_210,__str);
    std::__cxx11::string::~string((string *)local_230);
    std::allocator<char>::~allocator((allocator<char> *)&mf_u.field_0xf);
    mf_u._14_1_ = 0;
    lf::mesh::utils::
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc:123:18)>
    ::MeshFunctionGlobal
              ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:123:18)>
                *)local_248);
    mf_u_grad._14_1_ = 0;
    lf::mesh::utils::
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc:133:23)>
    ::MeshFunctionGlobal
              ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>
                *)local_260);
    std::filesystem::__cxx11::path::path<char[132],std::filesystem::__cxx11::path>
              ((path *)&mesh_folder._M_cmpts,
               (char (*) [132])
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc"
               ,auto_format);
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
              ((path *)&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,(char (*) [7])0xac780f,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)local_2b8,&local_2e0,
               (path *)&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
    std::filesystem::__cxx11::path::~path
              ((path *)&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
    std::filesystem::__cxx11::path::~path(&local_2e0);
    mesh_name.field_2._12_4_ = 5;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&mesh_idx,
               (int *)((long)&desc.groups.
                              super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (int *)(mesh_name.field_2._M_local_buf + 0xc));
    for (mesh_name.field_2._8_4_ = 0; (int)mesh_name.field_2._8_4_ < 7;
        mesh_name.field_2._8_4_ = mesh_name.field_2._8_4_ + 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"> Mesh Nr. ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,mesh_name.field_2._8_4_);
      std::operator<<(poVar7,'\n');
      poVar7 = std::operator<<((ostream *)&std::cout,"\t> Loading Mesh");
      std::operator<<(poVar7,'\n');
      std::__cxx11::to_string((string *)&mesh_file._M_cmpts,mesh_name.field_2._8_4_);
      std::operator+(&local_368,"L",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mesh_file._M_cmpts);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                     &local_368,".msh");
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&mesh_file._M_cmpts);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&factory,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 auto_format);
      std::filesystem::__cxx11::operator/((path *)local_3b0,(path *)local_2b8,(path *)&factory);
      std::filesystem::__cxx11::path::~path((path *)&factory);
      reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 2;
      std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_3e0);
      std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
                ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
                 &local_478,&local_3e0);
      std::filesystem::__cxx11::path::string
                ((string *)
                 &mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(path *)local_3b0);
      lf::io::GmshReader::GmshReader
                ((GmshReader *)local_470,&local_478,
                 (string *)
                 &mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
      ~unique_ptr(&local_478);
      lf::io::GmshReader::mesh
                ((GmshReader *)
                 &fe_space_o1.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::operator<<((ostream *)&std::cout,"\t> Linear Lagrangian FE");
      std::
      make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>,std::shared_ptr<lf::mesh::Mesh_const>const&>
                ((shared_ptr<const_lf::mesh::Mesh> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      poVar7 = std::operator<<((ostream *)&std::cout," (");
      peVar8 = std::
               __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&solution_o1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      iVar4 = (*(peVar8->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
      poVar7 = std::operator<<(poVar7," DOFs)");
      std::operator<<(poVar7,'\n');
      std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)
                 &mf_grad_o1.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      solvePoisson((shared_ptr<const_lf::mesh::Mesh> *)local_4c8,
                   (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                   &fe_space_o1.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
                ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                 &mf_grad_o1.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_508,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(Matrix<double,__1,_1,_0,__1,_1> *)local_4c8);
      lf::fe::MeshFunctionGradFE<double,_double>::MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_4f8,&local_508,
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 &fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_508);
      std::operator<<((ostream *)&std::cout,"\t> Quadratic Lagrangian FE");
      std::
      make_shared<lf::uscalfe::FeSpaceLagrangeO2<double>,std::shared_ptr<lf::mesh::Mesh_const>const&>
                ((shared_ptr<const_lf::mesh::Mesh> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      poVar7 = std::operator<<((ostream *)&std::cout," (");
      peVar9 = std::
               __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&solution_o2.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      iVar4 = (*(peVar9->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
      poVar7 = std::operator<<(poVar7," DOFs)");
      std::operator<<(poVar7,'\n');
      std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,void>
                ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)
                 &mf_grad_o2.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      solvePoisson((shared_ptr<const_lf::mesh::Mesh> *)local_538,
                   (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                   &fe_space_o1.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
                ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                 &mf_grad_o2.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,void>
                ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_578,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_588,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_538);
      lf::fe::MeshFunctionGradFE<double,_double>::MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_568,&local_578,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_588);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_588);
      std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_578);
      poVar7 = std::operator<<((ostream *)&std::cout,"\t> Computing Error Norms");
      std::operator<<(poVar7,'\n');
      H1_err_o1._7_1_ = 0;
      peVar10 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&fe_space_o1.
                                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>
                (&local_610,(MeshFunctionGradFE<double,_double> *)local_4f8,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>
                  *)local_260);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>
                (&local_5d8,&local_610);
      MVar1 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:184:36),_lf::base::PredicateTrue>
                        (peVar10,&local_5d8,(anon_class_1_0_00000001 *)((long)&H1_err_o1 + 7),
                         (PredicateTrue *)((long)&H1_err_o2 + 7),0);
      dVar2 = sqrt(MVar1);
      lf::mesh::utils::
      MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc:133:23)>_>_>
      ::~MeshFunctionUnary(&local_5d8);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc:133:23)>_>
      ::~MeshFunctionBinary(&local_610);
      local_598 = dVar2;
      peVar10 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&fe_space_o1.
                                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>
                (&local_698,(MeshFunctionGradFE<double,_double> *)local_568,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>
                  *)local_260);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>
                (&local_660,&local_698);
      MVar1 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:133:23)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadfelshaped_cc:184:36),_lf::base::PredicateTrue>
                        (peVar10,&local_660,(anon_class_1_0_00000001 *)((long)&H1_err_o1 + 7),
                         &local_699,0);
      dVar2 = sqrt(MVar1);
      lf::mesh::utils::
      MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc:133:23)>_>_>
      ::~MeshFunctionUnary(&local_660);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadfelshaped.cc:133:23)>_>
      ::~MeshFunctionBinary(&local_698);
      local_620 = dVar2;
      peVar10 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&fe_space_o1.
                                 super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      uVar5 = (*peVar10->_vptr_Mesh[3])(peVar10,0);
      dVar2 = sqrt(1.0 / (double)uVar5);
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,0);
      *pSVar11 = dVar2;
      peVar8 = std::
               __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&solution_o1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      iVar4 = (*(peVar8->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x10))();
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,1);
      *pSVar11 = (double)uVar5;
      peVar9 = std::
               __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&solution_o2.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      iVar4 = (*(peVar9->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x10))();
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,2);
      dVar3 = local_598;
      *pSVar11 = (double)uVar5;
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,3);
      dVar2 = local_620;
      *pSVar11 = dVar3;
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,4);
      *pSVar11 = dVar2;
      lf::fe::MeshFunctionGradFE<double,_double>::~MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_568);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_538);
      std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_>::~shared_ptr
                ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      lf::fe::MeshFunctionGradFE<double,_double>::~MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_4f8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_4c8);
      std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_>::~shared_ptr
                ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                ((shared_ptr<const_lf::mesh::Mesh> *)
                 &fe_space_o1.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      lf::io::GmshReader::~GmshReader((GmshReader *)local_470);
      std::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
      ::~unique_ptr(&local_3e0);
      std::filesystem::__cxx11::path::~path((path *)local_3b0);
      std::__cxx11::string::~string((string *)local_348);
    }
    if (main::CSVFormat == '\0') {
      iVar4 = __cxa_guard_acquire(&main::CSVFormat);
      if (iVar4 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,", ",&local_6c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"\n",&local_6e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"",&local_711);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"",&local_739);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"",&local_761);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"",&local_789);
        Eigen::IOFormat::IOFormat
                  (&main::CSVFormat,-1,1,&local_6c0,&local_6e8,&local_710,&local_738,&local_760,
                   &local_788,' ');
        std::__cxx11::string::~string((string *)&local_788);
        std::allocator<char>::~allocator(&local_789);
        std::__cxx11::string::~string((string *)&local_760);
        std::allocator<char>::~allocator(&local_761);
        std::__cxx11::string::~string((string *)&local_738);
        std::allocator<char>::~allocator(&local_739);
        std::__cxx11::string::~string((string *)&local_710);
        std::allocator<char>::~allocator(&local_711);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator(&local_6c1);
        __cxa_atexit(Eigen::IOFormat::~IOFormat,&main::CSVFormat,&__dso_handle);
        __cxa_guard_release(&main::CSVFormat);
      }
    }
    std::ofstream::ofstream(local_990);
    std::ofstream::open(local_990,(_Ios_Openmode)local_210);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::format
              (&local_a88,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&mesh_idx,
               &main::CSVFormat);
    Eigen::operator<<((ostream *)local_990,&local_a88);
    Eigen::WithFormat<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~WithFormat(&local_a88);
    std::ofstream::close();
    argv_local._4_4_ = 0;
    output_file.field_2._8_4_ = 1;
    std::ofstream::~ofstream(local_990);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)&mesh_idx);
    std::filesystem::__cxx11::path::~path((path *)local_2b8);
    std::filesystem::__cxx11::path::~path((path *)&mesh_folder._M_cmpts);
    std::__cxx11::string::~string(local_210);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_180);
  boost::program_options::options_description::~options_description((options_description *)local_a0)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  const int num_meshes = 7;

  po::options_description desc("allowed options");
  desc.add_options()("output,o", po::value<std::string>(),
                     "Name of the output file");
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  if (vm.count("output") == 0) {
    std::cout << desc << '\n';
    return 1;
  }
  const std::string output_file = vm["output"].as<std::string>();

  // The analytic solution
  const auto u = [](const Eigen::Vector2d &x) -> double {
    const double r = x.norm();
    double phi = std::atan2(x[1], x[0]);
    if (phi < 0) {
      phi += 2 * lf::base::kPi;
    }
    return std::pow(r, 2. / 3) * std::sin(2. / 3 * phi);
  };
  const lf::mesh::utils::MeshFunctionGlobal mf_u(u);
  // The gradient of the analytic solution
  const auto u_grad = [](const Eigen::Vector2d &x) -> Eigen::Vector2d {
    const double r = x.norm();
    double phi = std::atan2(x[1], x[0]);
    if (phi < 0) {
      phi += 2 * lf::base::kPi;
    }
    Eigen::Vector2d grad;
    grad[0] = 2. / 3 * std::pow(r, -4. / 3) *
              (x[0] * std::sin(2. / 3 * phi) - x[1] * std::cos(2. / 3 * phi));
    grad[1] = 2. / 3 * std::pow(r, -4. / 3) *
              (x[1] * std::sin(2. / 3 * phi) + x[0] * std::cos(2. / 3 * phi));
    return grad;
  };
  const lf::mesh::utils::MeshFunctionGlobal mf_u_grad(u_grad);

  const std::filesystem::path here = __FILE__;
  const std::filesystem::path mesh_folder = here.parent_path() / "meshes";
  Eigen::MatrixXd results(num_meshes, 5);
  for (int mesh_idx = 0; mesh_idx < num_meshes; ++mesh_idx) {
    std::cout << "> Mesh Nr. " << mesh_idx << '\n';

    // Load the mesh
    std::cout << "\t> Loading Mesh" << '\n';
    const std::string mesh_name = "L" + std::to_string(mesh_idx) + ".msh";
    const std::filesystem::path mesh_file = mesh_folder / mesh_name;
    auto factory = std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
    const lf::io::GmshReader reader(std::move(factory), mesh_file.string());
    const auto mesh = reader.mesh();

    // Solve the problem with linear finite elements
    std::cout << "\t> Linear Lagrangian FE";
    const auto fe_space_o1 =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(mesh);
    std::cout << " (" << fe_space_o1->LocGlobMap().NumDofs() << " DOFs)"
              << '\n';
    const Eigen::VectorXd solution_o1 = solvePoisson(mesh, fe_space_o1);
    const lf::fe::MeshFunctionGradFE<double, double> mf_grad_o1(fe_space_o1,
                                                                solution_o1);

    // Solve the problem with quadratic finite elements
    std::cout << "\t> Quadratic Lagrangian FE";
    const auto fe_space_o2 =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO2<double>>(mesh);
    std::cout << " (" << fe_space_o2->LocGlobMap().NumDofs() << " DOFs)"
              << '\n';
    const Eigen::VectorXd solution_o2 = solvePoisson(mesh, fe_space_o2);
    const lf::fe::MeshFunctionGradFE<double, double> mf_grad_o2(fe_space_o2,
                                                                solution_o2);

    // Compute the errors
    std::cout << "\t> Computing Error Norms" << '\n';
    const auto quadrule_provider = [](const lf::mesh::Entity &entity) {
      return lf::quad::make_QuadRule(entity.RefEl(), 6);
    };
    const double H1_err_o1 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_grad_o1 - mf_u_grad),
        quadrule_provider));
    const double H1_err_o2 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_grad_o2 - mf_u_grad),
        quadrule_provider));

    // Store the mesh width, the number of DOFs and the errors
    results(mesh_idx, 0) = std::sqrt(1. / mesh->NumEntities(0));
    results(mesh_idx, 1) = fe_space_o1->LocGlobMap().NumDofs();
    results(mesh_idx, 2) = fe_space_o2->LocGlobMap().NumDofs();
    results(mesh_idx, 3) = H1_err_o1;
    results(mesh_idx, 4) = H1_err_o2;
  }

  // Output the resulting errors to a file
  const static Eigen::IOFormat CSVFormat(Eigen::StreamPrecision,
                                         Eigen::DontAlignCols, ", ", "\n");
  std::ofstream file;
  file.open(output_file);
  file << results.format(CSVFormat);
  file.close();

  return 0;
}